

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cVertexAttrib64BitTest.cpp
# Opt level: O0

void __thiscall
VertexAttrib64Bit::LimitTest::configureAttribute
          (LimitTest *this,_iteration iteration,attributeConfiguration *configuration,GLint n_type,
          GLuint program_id,bool use_arrays,bool use_vertex_array)

{
  glGetAttribLocationFunc p_Var1;
  GLint GVar2;
  GLuint GVar3;
  GLenum GVar4;
  ostream *poVar5;
  GLchar *pGVar6;
  MessageBuilder *pMVar7;
  TestError *this_00;
  int iVar8;
  int iVar9;
  int local_3b8;
  GLint column_1;
  GLint column_offset;
  GLint attribute_offset;
  GLint column;
  MessageBuilder local_388;
  string local_208 [32];
  GLuint local_1e8 [2];
  GLint attribute_location;
  stringstream local_1d8 [8];
  stringstream attribute_name;
  ostream local_1c8;
  int local_4c;
  int local_48;
  GLint attribute_ordinal;
  GLint i;
  GLint vertex_length;
  GLint n_columns;
  GLint n_rows;
  GLint n_elements;
  GLint group_offset;
  GLint attributes_index;
  bool use_vertex_array_local;
  GLint GStack_24;
  bool use_arrays_local;
  GLuint program_id_local;
  GLint n_type_local;
  attributeConfiguration *configuration_local;
  LimitTest *pLStack_10;
  _iteration iteration_local;
  LimitTest *this_local;
  
  group_offset._2_1_ = use_vertex_array;
  n_elements = n_type * configuration->m_n_attributes_per_group;
  group_offset._3_1_ = use_arrays;
  attributes_index = program_id;
  GStack_24 = n_type;
  _program_id_local = configuration;
  configuration_local._4_4_ = iteration;
  pLStack_10 = this;
  n_rows = calculateAttributeGroupOffset(this,configuration,n_type);
  n_columns = _program_id_local->m_n_elements[GStack_24];
  vertex_length = _program_id_local->m_n_rows[GStack_24];
  i = n_columns / vertex_length;
  attribute_ordinal = _program_id_local->m_vertex_length;
  local_48 = 0;
  while( true ) {
    if (_program_id_local->m_n_attributes_per_group <= local_48) {
      return;
    }
    local_4c = local_48 + n_elements;
    std::__cxx11::stringstream::stringstream(local_1d8);
    if ((group_offset._3_1_ & 1) == 0) {
      poVar5 = std::operator<<(&local_1c8,"attribute_");
      std::ostream::operator<<(poVar5,local_4c);
    }
    else {
      poVar5 = std::operator<<(&local_1c8,"attribute_");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,GStack_24);
      poVar5 = std::operator<<(poVar5,"[");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_48);
      std::operator<<(poVar5,"]");
    }
    GVar2 = attributes_index;
    p_Var1 = (this->super_Base).gl.getAttribLocation;
    std::__cxx11::stringstream::str();
    pGVar6 = (GLchar *)std::__cxx11::string::c_str();
    GVar3 = (*p_Var1)(GVar2,pGVar6);
    std::__cxx11::string::~string(local_208);
    local_1e8[0] = GVar3;
    GVar4 = (*(this->super_Base).gl.getError)();
    glu::checkError(GVar4,"GetAttribLocation",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cVertexAttrib64BitTest.cpp"
                    ,0x695);
    if (local_1e8[0] == 0xffffffff) break;
    if ((group_offset._2_1_ & 1) == 1) {
      for (column_offset = 0; column_offset < i; column_offset = column_offset + 1) {
        iVar8 = n_rows + local_48 * n_columns;
        iVar9 = column_offset * vertex_length;
        (*(this->super_Base).gl.enableVertexAttribArray)(local_1e8[0] + column_offset);
        GVar4 = (*(this->super_Base).gl.getError)();
        glu::checkError(GVar4,"EnableVertexAttribArray",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cVertexAttrib64BitTest.cpp"
                        ,0x6a9);
        (*(this->super_Base).gl.vertexAttribLPointer)
                  (local_1e8[0] + column_offset,vertex_length,0x140a,attribute_ordinal << 3,
                   (void *)((long)(iVar8 + iVar9) << 3));
        GVar4 = (*(this->super_Base).gl.getError)();
        glu::checkError(GVar4,"VertexAttribLPointer",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cVertexAttrib64BitTest.cpp"
                        ,0x6ae);
      }
    }
    else {
      for (local_3b8 = 0; local_3b8 < i; local_3b8 = local_3b8 + 1) {
        if (configuration_local._4_4_ == DOUBLE_DVEC2) {
          if (vertex_length == 1) {
            (*(this->super_Base).gl.vertexAttribL1d)(local_1e8[0],(double)local_4c);
          }
          else {
            (*(this->super_Base).gl.vertexAttribL2d)
                      (local_1e8[0],(double)(local_4c + 1),(double)(local_4c + 2));
          }
        }
        else if (configuration_local._4_4_ == DVEC3_DVEC4) {
          if (vertex_length == 3) {
            (*(this->super_Base).gl.vertexAttribL3d)
                      (local_1e8[0],(double)local_4c,(double)(local_4c + 1),(double)(local_4c + 2));
          }
          else {
            (*(this->super_Base).gl.vertexAttribL4d)
                      (local_1e8[0],(double)local_4c,(double)(local_4c + 1),(double)(local_4c + 2),
                       (double)(local_4c + 3));
          }
        }
        else if (configuration_local._4_4_ - DMAT2 < 5) {
          if (vertex_length == 2) {
            (*(this->super_Base).gl.vertexAttribL2d)
                      (local_1e8[0] + local_3b8,(double)(GStack_24 + local_4c + local_3b8 * 2),
                       (double)(local_3b8 * 2 + 1 + GStack_24 + local_4c));
          }
          else if (vertex_length == 3) {
            iVar8 = GStack_24 + local_4c;
            iVar9 = local_3b8 * 3;
            (*(this->super_Base).gl.vertexAttribL3d)
                      (local_1e8[0] + local_3b8,(double)(iVar8 + iVar9),(double)(iVar9 + 1 + iVar8),
                       (double)(iVar9 + 2 + iVar8));
          }
          else {
            iVar8 = GStack_24 + local_4c;
            iVar9 = local_3b8 * vertex_length;
            (*(this->super_Base).gl.vertexAttribL4d)
                      (local_1e8[0] + local_3b8,(double)(iVar8 + iVar9),(double)(iVar9 + 1 + iVar8),
                       (double)(iVar9 + 2 + iVar8),(double)(iVar9 + 3 + iVar8));
          }
        }
      }
    }
    std::__cxx11::stringstream::~stringstream(local_1d8);
    local_48 = local_48 + 1;
  }
  tcu::TestLog::operator<<
            (&local_388,(this->super_Base).m_log,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar7 = tcu::MessageBuilder::operator<<(&local_388,(char (*) [19])0x2b3d8e3);
  pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(uint *)&attributes_index);
  pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [3])0x2a3caab);
  std::__cxx11::stringstream::str();
  pMVar7 = tcu::MessageBuilder::operator<<
                     (pMVar7,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &attribute_offset);
  pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [13])0x2b392f4);
  pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(int *)local_1e8);
  tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::string::~string((string *)&attribute_offset);
  tcu::MessageBuilder::~MessageBuilder(&local_388);
  this_00 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_00,"Inactive attribute",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cVertexAttrib64BitTest.cpp"
             ,0x69c);
  __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
}

Assistant:

void LimitTest::configureAttribute(_iteration iteration, const attributeConfiguration& configuration, GLint n_type,
								   GLuint program_id, bool use_arrays, bool use_vertex_array) const
{
	static const GLint invalid_attrib_location = -1;

	const GLint attributes_index = n_type * configuration.m_n_attributes_per_group;
	const GLint group_offset	 = calculateAttributeGroupOffset(configuration, n_type);
	const GLint n_elements		 = configuration.m_n_elements[n_type];
	const GLint n_rows			 = configuration.m_n_rows[n_type];
	const GLint n_columns		 = n_elements / n_rows;
	const GLint vertex_length	= configuration.m_vertex_length;

	/* For each attribute in "n_type" group */
	for (GLint i = 0; i < configuration.m_n_attributes_per_group; ++i)
	{
		const GLint		  attribute_ordinal = i + attributes_index;
		std::stringstream attribute_name;

		/* Separate attributes are called: attribute_ORDINAL, arrayed: attribute_N_TYPE[INDEX] */
		if (false == use_arrays)
		{
			attribute_name << "attribute_" << attribute_ordinal;
		}
		else
		{
			attribute_name << "attribute_" << n_type << "[" << i << "]";
		}

		/* get location */
		GLint attribute_location = gl.getAttribLocation(program_id, attribute_name.str().c_str());
		GLU_EXPECT_NO_ERROR(gl.getError(), "GetAttribLocation");

		if (invalid_attrib_location == attribute_location)
		{
			m_log << tcu::TestLog::Message << "GetAttribLocation(" << program_id << ", " << attribute_name.str()
				  << ") returned: " << attribute_location << tcu::TestLog::EndMessage;

			TCU_FAIL("Inactive attribute");
		}

		/* Configure */
		if (true == use_vertex_array)
		{
			/* With vertex array */
			for (GLint column = 0; column < n_columns; ++column)
			{
				const GLint attribute_offset = group_offset + i * n_elements;
				const GLint column_offset	= column * n_rows;

				gl.enableVertexAttribArray(attribute_location + column);
				GLU_EXPECT_NO_ERROR(gl.getError(), "EnableVertexAttribArray");

				gl.vertexAttribLPointer(attribute_location + column, n_rows /* size */, GL_DOUBLE,
										static_cast<glw::GLsizei>(vertex_length * sizeof(GLdouble)),
										(GLvoid*)((attribute_offset + column_offset) * sizeof(GLdouble)));
				GLU_EXPECT_NO_ERROR(gl.getError(), "VertexAttribLPointer");
			}
		}
		else
		{
			/* As constant */
			for (GLint column = 0; column < n_columns; ++column)
			{
				switch (iteration)
				{
				case DOUBLE_DVEC2:

					/* Double attributes should be assigned the value:
					 (n_attribute + gl_VertexID * 2) */
					/* Dvec2 attribute components should be assigned the following
					 vector values:
					 (n_attribute + gl_VertexID * 3 + 1,
					 n_attribute + gl_VertexID * 3 + 2)*/

					if (1 == n_rows)
					{
						gl.vertexAttribL1d(attribute_location, attribute_ordinal);
					}
					else
					{
						gl.vertexAttribL2d(attribute_location, attribute_ordinal + 1, attribute_ordinal + 2);
					}

					break;

				case DVEC3_DVEC4:

					/* Dvec3 attribute components should be assigned the following
					 vector values:
					 (n_attribute + gl_VertexID * 3 + 0,
					 n_attribute + gl_VertexID * 3 + 1,
					 n_attribute + gl_VertexID * 3 + 2).

					 Dvec4 attribute components should be assigned the following
					 vector values:
					 (n_attribute + gl_VertexID * 4 + 0,
					 n_attribute + gl_VertexID * 4 + 1,
					 n_attribute + gl_VertexID * 4 + 2,
					 n_attribute + gl_VertexID * 4 + 3).*/

					if (3 == n_rows)
					{
						gl.vertexAttribL3d(attribute_location, attribute_ordinal + 0, attribute_ordinal + 1,
										   attribute_ordinal + 2);
					}
					else
					{
						gl.vertexAttribL4d(attribute_location, attribute_ordinal + 0, attribute_ordinal + 1,
										   attribute_ordinal + 2, attribute_ordinal + 3);
					}

					break;

				case DMAT2:
				case DMAT3X2_DMAT4X2:
				case DMAT2X3_DMAT2X4:
				case DMAT3_DMAT3X4:
				case DMAT4X3_DMAT4:

					/* Subsequent matrix elements should be assigned the following value:
					 (n_type + n_attribute + gl_VertexID * 16 + n_value)*/

					if (2 == n_rows)
					{
						gl.vertexAttribL2d(attribute_location + column,
										   n_type + attribute_ordinal + 0 + column * n_rows,
										   n_type + attribute_ordinal + 1 + column * n_rows);
					}
					else if (3 == n_rows)
					{
						gl.vertexAttribL3d(attribute_location + column,
										   n_type + attribute_ordinal + 0 + column * n_rows,
										   n_type + attribute_ordinal + 1 + column * n_rows,
										   n_type + attribute_ordinal + 2 + column * n_rows);
					}
					else
					{
						gl.vertexAttribL4d(attribute_location + column,
										   n_type + attribute_ordinal + 0 + column * n_rows,
										   n_type + attribute_ordinal + 1 + column * n_rows,
										   n_type + attribute_ordinal + 2 + column * n_rows,
										   n_type + attribute_ordinal + 3 + column * n_rows);
					}

					break;
				}
			}
		}
	}
}